

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcPrintBasicVariableInfo(ExternTypeInfo *type,char *ptr)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  markerType *marker;
  void *base;
  char *codeSymbols;
  char *ptr_local;
  ExternTypeInfo *type_local;
  
  pcVar2 = nullcDebugSymbols((uint *)0x0);
  if (type->subCat == CAT_POINTER) {
    pvVar3 = NULLC::GetBasePointer(*(void **)ptr);
    if (pvVar3 == (void *)0x0) {
      printf("%p",*(undefined8 *)ptr);
    }
    else {
      printf("%p [base %p, ",*(undefined8 *)ptr,pvVar3);
      nullcPrintPointerMarkerInfo(*(markerType *)((long)pvVar3 + -8));
      printf("]");
    }
  }
  else {
    switch(type->type) {
    case TYPE_INT:
      pcVar2 = "0x%x";
      if ((type->field_11).subType == 0) {
        pcVar2 = "%d";
      }
      printf(pcVar2,(ulong)*(uint *)ptr);
      break;
    case TYPE_FLOAT:
      printf("%f",(double)*(float *)ptr);
      break;
    case TYPE_LONG:
      pcVar2 = "0x%llx";
      if ((type->field_11).subType == 0) {
        pcVar2 = "%lld";
      }
      printf(pcVar2,*(undefined8 *)ptr);
      break;
    case TYPE_DOUBLE:
      printf("%f",*(undefined8 *)ptr);
      break;
    case TYPE_SHORT:
      printf("%d",(ulong)(uint)(int)*(short *)ptr);
      break;
    case TYPE_CHAR:
      iVar1 = strcmp(pcVar2 + type->offsetToName,"bool");
      if (iVar1 == 0) {
        pcVar2 = "false";
        if (*ptr != '\0') {
          pcVar2 = "true";
        }
        printf(pcVar2);
      }
      else if (*ptr == '\0') {
        printf("0");
      }
      else {
        printf("\'%c\' (%d)",(ulong)(byte)*ptr,(ulong)(byte)*ptr);
      }
      break;
    default:
      printf("not basic type");
    }
  }
  return;
}

Assistant:

void nullcPrintBasicVariableInfo(const ExternTypeInfo& type, char* ptr)
{
	char *codeSymbols = nullcDebugSymbols(NULL);

	if(type.subCat == ExternTypeInfo::CAT_POINTER)
	{
		if(void *base = NULLC::GetBasePointer(*(void**)ptr))
		{
			markerType *marker = (markerType*)((char*)base - sizeof(markerType));

			printf("%p [base %p, ", *(void**)ptr, base);
			nullcPrintPointerMarkerInfo(*marker);
			printf("]");
		}
		else
		{
			printf("%p", *(void**)ptr);
		}

		return;
	}

	switch(type.type)
	{
	case ExternTypeInfo::TYPE_CHAR:
		if(strcmp(codeSymbols + type.offsetToName, "bool") == 0)
		{
			printf(*(unsigned char*)ptr ? "true" : "false");
		}
		else
		{
			if(*(unsigned char*)ptr)
				printf("'%c' (%d)", *(unsigned char*)ptr, (int)*(unsigned char*)ptr);
			else
				printf("0");
		}
		break;
	case ExternTypeInfo::TYPE_SHORT:
		printf("%d", *(short*)ptr);
		break;
	case ExternTypeInfo::TYPE_INT:
		printf(type.subType == 0 ? "%d" : "0x%x", *(int*)ptr);
		break;
	case ExternTypeInfo::TYPE_LONG:
		printf(type.subType == 0 ? "%lld" : "0x%llx", *(long long*)ptr);
		break;
	case ExternTypeInfo::TYPE_FLOAT:
		printf("%f", *(float*)ptr);
		break;
	case ExternTypeInfo::TYPE_DOUBLE:
		printf("%f", *(double*)ptr);
		break;
	default:
		printf("not basic type");
	}
}